

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

Sym * __thiscall GlobOpt::SetSymStore(GlobOpt *this,ValueInfo *valueInfo,Sym *sym)

{
  bool bVar1;
  StackSym *this_00;
  Sym *pSVar2;
  StackSym *stackSym;
  Sym *sym_local;
  ValueInfo *valueInfo_local;
  GlobOpt *this_local;
  
  bVar1 = Sym::IsStackSym(sym);
  stackSym = (StackSym *)sym;
  if (bVar1) {
    this_00 = Sym::AsStackSym(sym);
    bVar1 = StackSym::IsTypeSpec(this_00);
    if (bVar1) {
      stackSym = StackSym::GetVarEquivSym(this_00,this->func);
    }
  }
  pSVar2 = ValueInfo::GetSymStore(valueInfo);
  if (pSVar2 != (Sym *)0x0) {
    pSVar2 = ValueInfo::GetSymStore(valueInfo);
    bVar1 = Sym::IsPropertySym(pSVar2);
    if (!bVar1) {
      return &stackSym->super_Sym;
    }
  }
  SetSymStoreDirect(this,valueInfo,&stackSym->super_Sym);
  return &stackSym->super_Sym;
}

Assistant:

Sym *
GlobOpt::SetSymStore(ValueInfo *valueInfo, Sym *sym)
{
    if (sym->IsStackSym())
    {
        StackSym *stackSym = sym->AsStackSym();

        if (stackSym->IsTypeSpec())
        {
            stackSym = stackSym->GetVarEquivSym(this->func);
            sym = stackSym;
        }
    }
    if (valueInfo->GetSymStore() == nullptr || valueInfo->GetSymStore()->IsPropertySym())
    {
        SetSymStoreDirect(valueInfo, sym);
    }

    return sym;
}